

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int cuddSifting(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int *piVar3;
  void *__base;
  ulong uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode *pDVar8;
  long lVar9;
  int iVar10;
  DdNode *moves;
  DdHalfWord y;
  
  uVar1 = table->size;
  __size = (long)(int)uVar1 * 4;
  piVar3 = (int *)malloc(__size);
  entry = piVar3;
  if (piVar3 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
  }
  else {
    __base = malloc(__size);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar4 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        piVar3[uVar4] = table->subtables[table->perm[uVar4]].keys;
        *(int *)((long)__base + uVar4 * 4) = (int)uVar4;
      }
      qsort(__base,(long)(int)uVar1,4,ddUniqueCompare);
      lVar9 = 0;
      while( true ) {
        uVar2 = table->siftMaxVar;
        if ((int)uVar1 < table->siftMaxVar) {
          uVar2 = uVar1;
        }
        if (((int)uVar2 <= lVar9) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
          free(__base);
          if (entry == (int *)0x0) {
            return 1;
          }
          free(entry);
          entry = (int *)0x0;
          return 1;
        }
        y = table->perm[*(int *)((long)__base + lVar9 * 4)];
        if (((int)y <= upper && lower <= (int)y) && (table->subtables[(int)y].bindVar != 1)) break;
LAB_00669d67:
        lVar9 = lVar9 + 1;
      }
      iVar10 = table->keys - table->isolated;
      if (y == lower) {
        pDVar5 = (DdNode *)ddSiftingDown(table,lower,upper);
        if (pDVar5 != (DdNode *)0xffffffffffffffff) {
          iVar10 = ddSiftingBackward(table,iVar10,(Move *)pDVar5);
          moves = (DdNode *)0x0;
          goto LAB_00669e79;
        }
LAB_00669f4e:
        moves = (DdNode *)0x0;
LAB_00669f51:
        pDVar5 = (DdNode *)0xffffffffffffffff;
      }
      else {
        if (upper == y) {
          moves = (DdNode *)ddSiftingUp(table,upper,lower);
          if (moves == (DdNode *)0xffffffffffffffff) {
LAB_00669f56:
            moves = (DdNode *)0xffffffffffffffff;
            pDVar5 = (DdNode *)0x0;
            goto LAB_00669f62;
          }
          iVar10 = ddSiftingBackward(table,iVar10,(Move *)moves);
          pDVar5 = (DdNode *)0x0;
        }
        else {
          if ((int)(upper - y) < (int)(y - lower)) {
            pDVar5 = (DdNode *)ddSiftingDown(table,y,upper);
            if (pDVar5 != (DdNode *)0x0) {
              if (pDVar5 == (DdNode *)0xffffffffffffffff) goto LAB_00669f4e;
              y = pDVar5->ref;
            }
            pDVar6 = (DdNode *)ddSiftingUp(table,y,lower);
            moves = pDVar6;
            if (pDVar6 == (DdNode *)0xffffffffffffffff) {
              moves = (DdNode *)0xffffffffffffffff;
              goto LAB_00669f62;
            }
          }
          else {
            moves = (DdNode *)ddSiftingUp(table,y,lower);
            if (moves != (DdNode *)0x0) {
              if (moves == (DdNode *)0xffffffffffffffff) goto LAB_00669f56;
              y = moves->index;
            }
            pDVar6 = (DdNode *)ddSiftingDown(table,y,upper);
            pDVar5 = pDVar6;
            if (pDVar6 == (DdNode *)0xffffffffffffffff) goto LAB_00669f51;
          }
          iVar10 = ddSiftingBackward(table,iVar10,(Move *)pDVar6);
        }
LAB_00669e79:
        if (iVar10 != 0) {
          while (pDVar5 != (DdNode *)0x0) {
            pDVar6 = (pDVar5->type).kids.T;
            pDVar5->ref = 0;
            pDVar5->next = table->nextFree;
            table->nextFree = pDVar5;
            pDVar5 = pDVar6;
          }
          while (moves != (DdNode *)0x0) {
            pDVar5 = (moves->type).kids.T;
            moves->ref = 0;
            moves->next = table->nextFree;
            table->nextFree = moves;
            moves = pDVar5;
          }
          goto LAB_00669d67;
        }
      }
LAB_00669f62:
      if ((undefined1 *)0x1 < (undefined1 *)((long)&pDVar5->index + 1U)) {
        pDVar6 = table->nextFree;
        do {
          pDVar8 = pDVar5;
          pDVar5 = (pDVar8->type).kids.T;
          pDVar8->ref = 0;
          pDVar8->next = pDVar6;
          pDVar6 = pDVar8;
        } while (pDVar5 != (DdNode *)0x0);
        table->nextFree = pDVar8;
      }
      if ((undefined1 *)0x1 < (undefined1 *)((long)&moves->index + 1U)) {
        pDVar5 = table->nextFree;
        do {
          pDVar6 = moves;
          moves = (pDVar6->type).kids.T;
          pDVar6->ref = 0;
          pDVar6->next = pDVar5;
          pDVar5 = pDVar6;
        } while (moves != (DdNode *)0x0);
        table->nextFree = pDVar6;
      }
    }
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
  }
  free(__base);
  return 0;
}

Assistant:

int
cuddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,(size_t)size,sizeof(int),(DD_QSFP)ddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        result = ddSiftingAux(table, x, lower, upper);
        if (!result) goto cuddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->err,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keys - table->isolated, var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

cuddSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}